

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-test.cc
# Opt level: O0

void __thiscall
OptionTest_InvalidOption_Test::OptionTest_InvalidOption_Test(OptionTest_InvalidOption_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__OptionTest_InvalidOption_Test_001a35a8;
  return;
}

Assistant:

TEST(OptionTest, InvalidOption) {
  mp::OptionList options;
  testing::StrictMock<MockHandler> handler;
  mp::OptionList::Builder<MockHandler> builder(options, handler);
  builder.Add<&MockHandler::OnOption1>('a', "test option 1");
  char arg0[] = "-bad";
  char *args[] = {arg0, 0}, **argp = args;
  EXPECT_THROW_MSG(ParseOptions(argp, options), mp::OptionError,
                   "invalid option '-bad'");
}